

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v5::internal::
     parse_format_string<false,wchar_t,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>&>
               (basic_string_view<wchar_t> format_str,
               format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
               *handler)

{
  bool bVar1;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
  *end_00;
  size_t sVar2;
  error_handler *in_RDX;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
  *in_RDI;
  wchar_t c;
  wchar_t *p;
  wchar_t *end;
  wchar_t *begin;
  writer write;
  wchar_t local_54;
  undefined4 in_stack_ffffffffffffffb8;
  wchar_t in_stack_ffffffffffffffbc;
  error_handler *in_stack_ffffffffffffffc0;
  error_handler *this;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
  *local_38;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
  *this_00;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
  *pfVar3;
  error_handler *peVar4;
  
  peVar4 = in_RDX;
  end_00 = (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
            *)basic_string_view<wchar_t>::data
                        ((basic_string_view<wchar_t> *)&stack0xfffffffffffffff0);
  pfVar3 = end_00;
  sVar2 = basic_string_view<wchar_t>::size((basic_string_view<wchar_t> *)&stack0xfffffffffffffff0);
  this_00 = (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
             *)((long)&end_00->field_0x0 + sVar2 * 4);
  local_38 = pfVar3;
  do {
    if (local_38 == this_00) {
      return;
    }
    local_54 = in_stack_ffffffffffffffbc;
    this = in_stack_ffffffffffffffc0;
    pfVar3 = local_38;
    if ((*(int *)local_38 != 0x7b) &&
       (bVar1 = find<false,char,wchar_t_const*>
                          ((wchar_t *)local_38,(wchar_t *)this_00,'{',(wchar_t **)&local_38),
       local_54 = in_stack_ffffffffffffffbc, this = in_stack_ffffffffffffffc0, !bVar1)) {
      parse_format_string<false,_wchar_t,_fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_&>
      ::writer::operator()
                ((writer *)in_stack_ffffffffffffffc0,
                 (wchar_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 (wchar_t *)end_00);
      return;
    }
    in_stack_ffffffffffffffc0 = peVar4;
    parse_format_string<false,_wchar_t,_fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_&>
    ::writer::operator()
              ((writer *)this,(wchar_t *)CONCAT44(local_54,in_stack_ffffffffffffffb8),
               (wchar_t *)end_00);
    local_38 = (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                *)&local_38->field_0x4;
    if (local_38 == this_00) {
      error_handler::on_error(this,(char *)CONCAT44(local_54,in_stack_ffffffffffffffb8));
      return;
    }
    if ((char)*(undefined4 *)local_38 == '}') {
      format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
      ::on_arg_id(this_00);
      peVar4 = in_stack_ffffffffffffffc0;
      format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
      ::on_replacement_field(in_RDI,(wchar_t *)in_stack_ffffffffffffffc0);
      in_stack_ffffffffffffffc0 = this;
    }
    else {
      peVar4 = in_stack_ffffffffffffffc0;
      if (*(int *)local_38 == 0x7b) {
        format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
        ::on_text(in_RDI,(wchar_t *)in_stack_ffffffffffffffc0,(wchar_t *)in_RDX);
        in_stack_ffffffffffffffc0 = this;
      }
      else {
        local_38 = (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                    *)parse_arg_id<wchar_t,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>&,wchar_t>>
                                ((wchar_t *)in_stack_ffffffffffffffc0,(wchar_t *)in_RDX,
                                 (id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_&,_wchar_t>
                                  *)pfVar3);
        if (local_38 == this_00) {
          local_54 = L'\0';
        }
        else {
          local_54 = *(wchar_t *)local_38;
        }
        if (local_54 == L'}') {
          format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
          ::on_replacement_field(in_RDI,(wchar_t *)peVar4);
        }
        else {
          if (local_54 != L':') {
            error_handler::on_error
                      (in_stack_ffffffffffffffc0,
                       (char *)CONCAT44(local_54,in_stack_ffffffffffffffb8));
            return;
          }
          local_38 = (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                      *)format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                        ::on_format_specs(write.handler_,begin,end);
          if ((local_38 == this_00) || (*(wchar_t *)local_38 != L'}')) {
            error_handler::on_error
                      (in_stack_ffffffffffffffc0,
                       (char *)CONCAT44(local_54,in_stack_ffffffffffffffb8));
            return;
          }
        }
      }
    }
    local_38 = (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                *)&local_38->field_0x4;
    in_stack_ffffffffffffffbc = local_54;
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      if (begin == end) return;
      for (;;) {
        const Char *p = FMT_NULL;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char *p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end)
      return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}